

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

int ON_UuidIndex::CompareIndex(ON_UuidIndex *a,ON_UuidIndex *b)

{
  uint uVar1;
  
  if (a == (ON_UuidIndex *)0x0) {
    return -(uint)(b != (ON_UuidIndex *)0x0);
  }
  if (b != (ON_UuidIndex *)0x0) {
    uVar1 = 0xffffffff;
    if (b->m_i <= a->m_i) {
      uVar1 = (uint)(b->m_i < a->m_i);
    }
    return uVar1;
  }
  return 1;
}

Assistant:

int ON_UuidIndex::CompareIndex( const ON_UuidIndex* a, const ON_UuidIndex* b )
{
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;
  if (a->m_i < b->m_i)
    return -1;
  if (a->m_i > b->m_i)
    return 1;
  return 0;
}